

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O3

bool __thiscall vectorgraphics::TikzPlotter::createTexFile(TikzPlotter *this,path *tex_path)

{
  uint uVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ofstream ofs;
  long *local_240;
  long local_238;
  long local_230 [2];
  long local_220;
  filebuf local_218 [24];
  uint auStack_200 [54];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,(tex_path->_M_pathname)._M_dataplus._M_p,_S_out);
  uVar1 = *(uint *)((long)auStack_200 + *(long *)(local_220 + -0x18));
  if ((uVar1 & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\\documentclass[]{standalone}",0x1c);
    std::ios::widen((char)(ostream *)&local_220 + (char)*(undefined8 *)(local_220 + -0x18));
    std::ostream::put((char)&local_220);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\\usepackage[subpreambles=true]{standalone}",0x2a);
    std::ios::widen((char)(ostream *)&local_220 + (char)*(undefined8 *)(local_220 + -0x18));
    std::ostream::put((char)&local_220);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\\usepackage{tikz}",0x11);
    std::ios::widen((char)(ostream *)&local_220 + (char)*(undefined8 *)(local_220 + -0x18));
    std::ostream::put((char)&local_220);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,"\\begin{document}",0x10);
    std::ios::widen((char)(ostream *)&local_220 + (char)*(undefined8 *)(local_220 + -0x18));
    std::ostream::put((char)&local_220);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if (local_238 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_220,"\\begin{tikzpicture}",0x13);
      std::ios::widen((char)(ostream *)&local_220 + (char)*(undefined8 *)(local_220 + -0x18));
      std::ostream::put((char)&local_220);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_220,(char *)local_240,local_238);
      if (local_240 != local_230) {
        operator_delete(local_240,local_230[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_220,"\\end{tikzpicture}",0x11);
      std::ios::widen((char)(ostream *)&local_220 + (char)*(undefined8 *)(local_220 + -0x18));
      std::ostream::put((char)&local_220);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"\\end{document}",0xe);
    std::ios::widen((char)(ostream *)&local_220 + (char)*(undefined8 *)(local_220 + -0x18));
    std::ostream::put((char)&local_220);
    std::ostream::flush();
    std::ofstream::close();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error in createTexFile: opening output file at ",0x2f);
    pbVar2 = std::filesystem::__cxx11::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,tex_path);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar2 + -0x18) + (char)pbVar2);
    std::ostream::put((char)pbVar2);
    std::ostream::flush();
  }
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _remove;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return (uVar1 & 5) == 0;
}

Assistant:

bool TikzPlotter::createTexFile(std::filesystem::path tex_path) const {
    std::ofstream ofs(tex_path);

    if (!ofs) {
      std::cout << "Error in createTexFile: opening output file at " << tex_path << std::endl;
      return false;
    }

    ofs << R"(\documentclass[]{standalone})" << std::endl;
    ofs << R"(\usepackage[subpreambles=true]{standalone})" << std::endl;
    ofs << R"(\usepackage{tikz})" << std::endl;
    ofs << R"(\begin{document})" << std::endl;

    if (content.str().size() != 0) {
      ofs << R"(\begin{tikzpicture})" << std::endl;

      ofs << content.str();

      ofs << R"(\end{tikzpicture})" << std::endl;
    }
    ofs << R"(\end{document})" << std::endl;

    ofs.close();
    return true;
  }